

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O2

long ParseCommandLine(char *args,int *argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (argv == (char **)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = *argv;
  }
  lVar3 = 0;
LAB_003b7c7c:
  pcVar4 = args;
  cVar5 = *pcVar4;
  args = pcVar4 + 1;
  if (cVar5 < '!') goto code_r0x003b7c88;
  goto LAB_003b7c8d;
code_r0x003b7c88:
  if (cVar5 == '\0') {
LAB_003b7c8d:
    if (cVar5 == '\"') {
      pcVar7 = pcVar2;
      if (argv != (char **)0x0) {
        argv[lVar3] = pcVar2;
      }
      do {
        cVar5 = *args;
        pcVar6 = args;
        if (cVar5 != '\0') {
          pcVar6 = args + 1;
          if (cVar5 == '\"') {
            cVar5 = '\0';
          }
          else if ((cVar5 == '\\') && (*pcVar6 == '\"')) {
            pcVar6 = args + 2;
            cVar5 = '\"';
          }
        }
        if (argv != (char **)0x0) {
          *pcVar7 = cVar5;
        }
        pcVar7 = pcVar7 + 1;
        args = pcVar6;
      } while (cVar5 != '\0');
    }
    else {
      if (cVar5 == '\0') {
        if (argc != (int *)0x0) {
          *argc = (int)lVar3;
        }
        return (long)pcVar2;
      }
      pcVar6 = pcVar4;
      pcVar7 = pcVar2 + 1;
      do {
        pcVar1 = pcVar6 + 1;
        pcVar6 = pcVar6 + 1;
        pcVar7 = pcVar7 + 1;
        if (*pcVar1 < '!') break;
      } while (*pcVar1 != '\"');
      if (argv != (char **)0x0) {
        argv[lVar3] = pcVar2;
        pcVar7 = pcVar2 + 1;
        for (; pcVar4 < pcVar6; pcVar4 = pcVar4 + 1) {
          pcVar7[-1] = *pcVar4;
          pcVar7 = pcVar7 + 1;
        }
        pcVar7[-1] = '\0';
      }
    }
    lVar3 = lVar3 + 1;
    pcVar2 = pcVar7;
    args = pcVar6;
  }
  goto LAB_003b7c7c;
}

Assistant:

static long ParseCommandLine (const char *args, int *argc, char **argv)
{
	int count;
	char *buffplace;

	count = 0;
	buffplace = NULL;
	if (argv != NULL)
	{
		buffplace = argv[0];
	}

	for (;;)
	{
		while (*args <= ' ' && *args)
		{ // skip white space
			args++;
		}
		if (*args == 0)
		{
			break;
		}
		else if (*args == '\"')
		{ // read quoted string
			char stuff;
			if (argv != NULL)
			{
				argv[count] = buffplace;
			}
			count++;
			args++;
			do
			{
				stuff = *args++;
				if (stuff == '\\' && *args == '\"')
				{
					stuff = '\"', args++;
				}
				else if (stuff == '\"')
				{
					stuff = 0;
				}
				else if (stuff == 0)
				{
					args--;
				}
				if (argv != NULL)
				{
					*buffplace = stuff;
				}
				buffplace++;
			} while (stuff);
		}
		else
		{ // read unquoted string
			const char *start = args++, *end;

			while (*args && *args > ' ' && *args != '\"')
				args++;
			end = args;
			if (argv != NULL)
			{
				argv[count] = buffplace;
				while (start < end)
					*buffplace++ = *start++;
				*buffplace++ = 0;
			}
			else
			{
				buffplace += end - start + 1;
			}
			count++;
		}
	}
	if (argc != NULL)
	{
		*argc = count;
	}
	return (long)(buffplace - (char *)0);
}